

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSystemTools.cxx
# Opt level: O0

int testSystemTools(int param_1,char **param_2)

{
  char escape_char;
  char *pcVar1;
  char *__s;
  bool bVar2;
  long lVar3;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string output;
  string local_78;
  allocator<char> local_41;
  string local_40;
  int local_20;
  byte local_19;
  int cc;
  bool res;
  char **param_1_local;
  int param_0_local;
  
  local_19 = 1;
  local_20 = 0;
  _cc = param_2;
  param_1_local._4_4_ = param_1;
  while (toUnixPaths[local_20][0] != (char *)0x0) {
    pcVar1 = toUnixPaths[local_20][0];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pcVar1,&local_41);
    pcVar1 = toUnixPaths[local_20][1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,pcVar1,(allocator<char> *)(output.field_2._M_local_buf + 0xf));
    bVar2 = CheckConvertToUnixSlashes(&local_40,&local_78);
    local_19 = (local_19 & 1 & bVar2) != 0;
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)(output.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    local_20 = local_20 + 1;
  }
  std::__cxx11::string::string((string *)local_a0);
  bVar2 = cmsys::SystemTools::GetEnv("HOME",(string *)local_a0);
  if (bVar2) {
    std::__cxx11::string::operator+=((string *)local_a0,"/foo bar/lala");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"~/foo bar/lala",&local_c1);
    bVar2 = CheckConvertToUnixSlashes(&local_c0,(string *)local_a0);
    local_19 = (local_19 & 1 & bVar2) != 0;
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
  }
  local_20 = 0;
  while (checkEscapeChars[local_20][0] != (char *)0x0) {
    pcVar1 = checkEscapeChars[local_20][0];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,pcVar1,&local_e9);
    lVar3 = (long)local_20;
    pcVar1 = checkEscapeChars[lVar3][1];
    escape_char = *checkEscapeChars[lVar3][2];
    __s = checkEscapeChars[lVar3][3];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,__s,&local_111);
    bVar2 = CheckEscapeChars(&local_e8,pcVar1,escape_char,&local_110);
    local_19 = (local_19 & 1 & bVar2) != 0;
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    local_20 = local_20 + 1;
  }
  bVar2 = CheckFileOperations();
  local_19 = bVar2 & local_19;
  bVar2 = CheckStringOperations();
  local_19 = bVar2 & local_19;
  bVar2 = CheckEnvironmentOperations();
  local_19 = bVar2 & local_19;
  bVar2 = CheckRelativePaths();
  local_19 = bVar2 & local_19;
  bVar2 = CheckCollapsePath();
  local_19 = bVar2 & local_19;
  bVar2 = CheckGetPath();
  local_19 = bVar2 & local_19;
  bVar2 = CheckFind();
  local_19 = bVar2 & local_19;
  bVar2 = CheckIsSubDirectory();
  local_19 = bVar2 & local_19;
  bVar2 = CheckGetLineFromStream();
  local_19 = bVar2 & local_19;
  bVar2 = CheckGetLineFromStreamLongLine();
  local_19 = bVar2 & local_19;
  bVar2 = CheckGetFilenameName();
  local_19 = bVar2 & local_19;
  bVar2 = CheckTextFilesDiffer();
  local_19 = bVar2 & local_19;
  bVar2 = CheckCopyFileIfDifferent();
  local_19 = bVar2 & local_19;
  bVar2 = CheckURLParsing();
  local_19 = bVar2 & local_19;
  bVar2 = CheckSplitString();
  local_19 = (local_19 & 1 & bVar2) != 0;
  bVar2 = !(bool)local_19;
  std::__cxx11::string::~string((string *)local_a0);
  return (uint)bVar2;
}

Assistant:

int testSystemTools(int, char*[])
{
  bool res = true;

  int cc;
  for (cc = 0; toUnixPaths[cc][0]; cc++) {
    res &= CheckConvertToUnixSlashes(toUnixPaths[cc][0], toUnixPaths[cc][1]);
  }

  // Special check for ~
  std::string output;
  if (kwsys::SystemTools::GetEnv("HOME", output)) {
    output += "/foo bar/lala";
    res &= CheckConvertToUnixSlashes("~/foo bar/lala", output);
  }

  for (cc = 0; checkEscapeChars[cc][0]; cc++) {
    res &= CheckEscapeChars(checkEscapeChars[cc][0], checkEscapeChars[cc][1],
                            *checkEscapeChars[cc][2], checkEscapeChars[cc][3]);
  }

  res &= CheckFileOperations();

  res &= CheckStringOperations();

  res &= CheckEnvironmentOperations();

  res &= CheckRelativePaths();

  res &= CheckCollapsePath();

  res &= CheckGetPath();

  res &= CheckFind();

  res &= CheckIsSubDirectory();

  res &= CheckGetLineFromStream();

  res &= CheckGetLineFromStreamLongLine();

  res &= CheckGetFilenameName();

  res &= CheckTextFilesDiffer();

  res &= CheckCopyFileIfDifferent();

  res &= CheckURLParsing();

  res &= CheckSplitString();

  return res ? 0 : 1;
}